

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O0

void __thiscall flow::BasicBlock::BasicBlock(BasicBlock *this,string *name,IRHandler *parent)

{
  IRHandler *parent_local;
  string *name_local;
  BasicBlock *this_local;
  
  Value::Value(&this->super_Value,Void,name);
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__BasicBlock_002b9458;
  this->handler_ = parent;
  memset(&this->code_,0,0x18);
  std::
  vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
  ::vector(&this->code_);
  memset(&this->predecessors_,0,0x18);
  std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::vector(&this->predecessors_)
  ;
  memset(&this->successors_,0,0x18);
  std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::vector(&this->successors_);
  return;
}

Assistant:

BasicBlock::BasicBlock(const std::string& name, IRHandler* parent)
    : Value(LiteralType::Void, name),
      handler_(parent),
      code_(),
      predecessors_(),
      successors_() {
}